

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

int TIFFRGBAImageOK(TIFF *tif,char *emsg)

{
  uint uVar1;
  int iVar2;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  ushort local_32;
  uint local_30;
  uint16_t inkset;
  int colorchannels;
  uint16_t photometric;
  TIFFDirectory *td;
  char *emsg_local;
  TIFF *tif_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  _colorchannels = &tif->tif_dir;
  td = (TIFFDirectory *)emsg;
  emsg_local = (char *)tif;
  if (tif->tif_decodestatus == 0) {
    snprintf(emsg,0x400,"Sorry, requested compression method is not configured");
    return 0;
  }
  uVar1 = (uint)(tif->tif_dir).td_bitspersample;
  if ((((1 < uVar1 - 1) && (uVar1 != 4)) && (uVar1 != 8)) && (uVar1 != 0x10)) {
    snprintf(emsg,0x400,"Sorry, can not handle images with %u-bit samples",
             (ulong)(tif->tif_dir).td_bitspersample);
    return 0;
  }
  if ((tif->tif_dir).td_sampleformat == 3) {
    snprintf(emsg,0x400,"Sorry, can not handle images with IEEE floating-point samples");
    return 0;
  }
  local_30 = (uint)(tif->tif_dir).td_samplesperpixel - (uint)(tif->tif_dir).td_extrasamples;
  iVar2 = TIFFGetField(tif,0x106,&inkset);
  if (iVar2 == 0) {
    if (local_30 == 1) {
      inkset = 1;
    }
    else {
      if (local_30 != 3) {
        snprintf((char *)td,0x400,"Missing needed %s tag","PhotometricInterpretation");
        return 0;
      }
      inkset = 2;
    }
  }
  if (1 < inkset) {
    if (inkset == 2) {
      if (2 < (int)local_30) {
        return 1;
      }
      snprintf((char *)td,0x400,"Sorry, can not handle RGB image with %s=%d","Color channels",
               (ulong)local_30);
      return 0;
    }
    if (inkset != 3) {
      if (inkset == 5) {
        TIFFGetFieldDefaulted((TIFF *)emsg_local,0x14c,&local_32);
        if (local_32 != 1) {
          snprintf((char *)td,0x400,"Sorry, can not handle separated image with %s=%d","InkSet",
                   (ulong)local_32);
          return 0;
        }
        if (3 < _colorchannels->td_samplesperpixel) {
          return 1;
        }
        snprintf((char *)td,0x400,"Sorry, can not handle separated image with %s=%u","Samples/pixel"
                 ,(ulong)_colorchannels->td_samplesperpixel);
        return 0;
      }
      if (inkset == 6) {
        return 1;
      }
      if (inkset == 8) {
        if ((_colorchannels->td_samplesperpixel == 3) && (local_30 == 3)) {
          if (_colorchannels->td_bitspersample == 8) {
            return 1;
          }
          if (_colorchannels->td_bitspersample == 0x10) {
            return 1;
          }
        }
        snprintf((char *)td,0x400,"Sorry, can not handle image with %s=%u, %s=%d and %s=%u",
                 "Samples/pixel",(ulong)_colorchannels->td_samplesperpixel,"colorchannels",local_30,
                 "Bits/sample",(uint)_colorchannels->td_bitspersample);
        return 0;
      }
      if (inkset == 0x804c) {
        if (_colorchannels->td_compression == 0x8774) {
          return 1;
        }
        snprintf((char *)td,0x400,"Sorry, LogL data must have %s=%d","Compression",0x8774);
        return 0;
      }
      if (inkset != 0x804d) {
        snprintf((char *)td,0x400,"Sorry, can not handle image with %s=%u",
                 "PhotometricInterpretation",(ulong)inkset);
        return 0;
      }
      if ((_colorchannels->td_compression != 0x8774) && (_colorchannels->td_compression != 0x8775))
      {
        snprintf((char *)td,0x400,"Sorry, LogLuv data must have %s=%d or %d","Compression",0x8774,
                 0x8775);
        return 0;
      }
      if (_colorchannels->td_planarconfig != 1) {
        snprintf((char *)td,0x400,"Sorry, can not handle LogLuv images with %s=%u",
                 "Planarconfiguration",(ulong)_colorchannels->td_planarconfig);
        return 0;
      }
      if ((_colorchannels->td_samplesperpixel == 3) && (local_30 == 3)) {
        return 1;
      }
      snprintf((char *)td,0x400,"Sorry, can not handle image with %s=%u, %s=%d","Samples/pixel",
               (ulong)_colorchannels->td_samplesperpixel,"colorchannels",local_30);
      return 0;
    }
  }
  if (((_colorchannels->td_planarconfig == 1) && (_colorchannels->td_samplesperpixel != 1)) &&
     (_colorchannels->td_bitspersample < 8)) {
    snprintf((char *)td,0x400,
             "Sorry, can not handle contiguous data with %s=%u, and %s=%u and Bits/Sample=%u",
             "PhotometricInterpretation",(ulong)inkset,"Samples/pixel",
             (uint)_colorchannels->td_samplesperpixel,
             CONCAT44(uVar3,(uint)_colorchannels->td_bitspersample));
    return 0;
  }
  return 1;
}

Assistant:

int TIFFRGBAImageOK(TIFF *tif, char emsg[EMSG_BUF_SIZE])
{
    TIFFDirectory *td = &tif->tif_dir;
    uint16_t photometric;
    int colorchannels;

    if (!tif->tif_decodestatus)
    {
        snprintf(emsg, EMSG_BUF_SIZE,
                 "Sorry, requested compression method is not configured");
        return (0);
    }
    switch (td->td_bitspersample)
    {
        case 1:
        case 2:
        case 4:
        case 8:
        case 16:
            break;
        default:
            snprintf(emsg, EMSG_BUF_SIZE,
                     "Sorry, can not handle images with %" PRIu16
                     "-bit samples",
                     td->td_bitspersample);
            return (0);
    }
    if (td->td_sampleformat == SAMPLEFORMAT_IEEEFP)
    {
        snprintf(
            emsg, EMSG_BUF_SIZE,
            "Sorry, can not handle images with IEEE floating-point samples");
        return (0);
    }
    colorchannels = td->td_samplesperpixel - td->td_extrasamples;
    if (!TIFFGetField(tif, TIFFTAG_PHOTOMETRIC, &photometric))
    {
        switch (colorchannels)
        {
            case 1:
                photometric = PHOTOMETRIC_MINISBLACK;
                break;
            case 3:
                photometric = PHOTOMETRIC_RGB;
                break;
            default:
                snprintf(emsg, EMSG_BUF_SIZE, "Missing needed %s tag",
                         photoTag);
                return (0);
        }
    }
    switch (photometric)
    {
        case PHOTOMETRIC_MINISWHITE:
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_PALETTE:
            if (td->td_planarconfig == PLANARCONFIG_CONTIG &&
                td->td_samplesperpixel != 1 && td->td_bitspersample < 8)
            {
                snprintf(
                    emsg, EMSG_BUF_SIZE,
                    "Sorry, can not handle contiguous data with %s=%" PRIu16
                    ", "
                    "and %s=%" PRIu16 " and Bits/Sample=%" PRIu16 "",
                    photoTag, photometric, "Samples/pixel",
                    td->td_samplesperpixel, td->td_bitspersample);
                return (0);
            }
            /*
             * We should likely validate that any extra samples are either
             * to be ignored, or are alpha, and if alpha we should try to use
             * them.  But for now we won't bother with this.
             */
            break;
        case PHOTOMETRIC_YCBCR:
            /*
             * TODO: if at all meaningful and useful, make more complete
             * support check here, or better still, refactor to let supporting
             * code decide whether there is support and what meaningful
             * error to return
             */
            break;
        case PHOTOMETRIC_RGB:
            if (colorchannels < 3)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, can not handle RGB image with %s=%d",
                         "Color channels", colorchannels);
                return (0);
            }
            break;
        case PHOTOMETRIC_SEPARATED:
        {
            uint16_t inkset;
            TIFFGetFieldDefaulted(tif, TIFFTAG_INKSET, &inkset);
            if (inkset != INKSET_CMYK)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, can not handle separated image with %s=%d",
                         "InkSet", inkset);
                return 0;
            }
            if (td->td_samplesperpixel < 4)
            {
                snprintf(
                    emsg, EMSG_BUF_SIZE,
                    "Sorry, can not handle separated image with %s=%" PRIu16,
                    "Samples/pixel", td->td_samplesperpixel);
                return 0;
            }
            break;
        }
        case PHOTOMETRIC_LOGL:
            if (td->td_compression != COMPRESSION_SGILOG)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, LogL data must have %s=%d", "Compression",
                         COMPRESSION_SGILOG);
                return (0);
            }
            break;
        case PHOTOMETRIC_LOGLUV:
            if (td->td_compression != COMPRESSION_SGILOG &&
                td->td_compression != COMPRESSION_SGILOG24)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, LogLuv data must have %s=%d or %d",
                         "Compression", COMPRESSION_SGILOG,
                         COMPRESSION_SGILOG24);
                return (0);
            }
            if (td->td_planarconfig != PLANARCONFIG_CONTIG)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, can not handle LogLuv images with %s=%" PRIu16,
                         "Planarconfiguration", td->td_planarconfig);
                return (0);
            }
            if (td->td_samplesperpixel != 3 || colorchannels != 3)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, can not handle image with %s=%" PRIu16
                         ", %s=%d",
                         "Samples/pixel", td->td_samplesperpixel,
                         "colorchannels", colorchannels);
                return 0;
            }
            break;
        case PHOTOMETRIC_CIELAB:
            if (td->td_samplesperpixel != 3 || colorchannels != 3 ||
                (td->td_bitspersample != 8 && td->td_bitspersample != 16))
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, can not handle image with %s=%" PRIu16
                         ", %s=%d and %s=%" PRIu16,
                         "Samples/pixel", td->td_samplesperpixel,
                         "colorchannels", colorchannels, "Bits/sample",
                         td->td_bitspersample);
                return 0;
            }
            break;
        default:
            snprintf(emsg, EMSG_BUF_SIZE,
                     "Sorry, can not handle image with %s=%" PRIu16, photoTag,
                     photometric);
            return (0);
    }
    return (1);
}